

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O1

function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)> * __thiscall
chaiscript::ChaiScript::eval<std::function<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>>
          (function<chaiscript::Boxed_Value_(const_chaiscript::Boxed_Value_&)>
           *__return_storage_ptr__,ChaiScript *this,string *t_input,Exception_Handler *t_handler,
          string *t_filename)

{
  undefined8 local_28;
  
  do_eval((ChaiScript *)&stack0xffffffffffffffd0,(string *)this,t_input,SUB81(t_filename,0));
  detail::Dispatch_Engine::
  boxed_cast<std::function<chaiscript::Boxed_Value(chaiscript::Boxed_Value_const&)>>
            (__return_storage_ptr__,&this->m_engine,(Boxed_Value *)&stack0xffffffffffffffd0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28);
  }
  return __return_storage_ptr__;
}

Assistant:

T eval(const std::string &t_input, const Exception_Handler &t_handler = Exception_Handler(), const std::string &t_filename="__EVAL__")
    {
      try {
        return m_engine.boxed_cast<T>(do_eval(t_input, t_filename));
      } catch (Boxed_Value &bv) {
        if (t_handler) {
          t_handler->handle(bv, m_engine);
        }
        throw;
      }
    }